

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O0

_Bool ControlTable(ECommand_t cmd)

{
  ECommand_t EVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  bool local_12;
  _Bool local_11;
  _Bool rv;
  ECommand_t cmd_local;
  
  local_11 = true;
  if (ActiveCmd == CMD_NONE) {
    if (cmd == CMD_NEXT) {
      tbl_DrawNextCard();
      EVar1 = ActiveCmd;
    }
    else {
      EVar1 = cmd;
      if (((cmd != CMD_PACK) && (_Var2 = IsCmdDesk(cmd), EVar1 = cmd, !_Var2)) &&
         (_Var2 = IsCmdColor(cmd), EVar1 = cmd, !_Var2)) {
        if (cmd != CMD_LAZY) {
          return false;
        }
        local_11 = AutoMove();
        EVar1 = ActiveCmd;
      }
    }
  }
  else {
    local_11 = false;
    _Var2 = IsCmdColor(cmd);
    if ((_Var2) || (cmd == ActiveCmd)) {
      if (ActiveCmd == CMD_PACK) {
        local_11 = tbl_MovePackToColors();
      }
      else {
        _Var2 = IsCmdDesk(ActiveCmd);
        if (_Var2) {
          iVar3 = GetStackIdx(cmd);
          local_11 = tbl_MoveDeskToColors(iVar3);
        }
        else {
          local_11 = false;
        }
      }
      local_12 = local_11 != false || ActiveCmd == cmd;
      local_11 = local_12;
    }
    else {
      _Var2 = IsCmdDesk(cmd);
      if (_Var2) {
        if (ActiveCmd == CMD_PACK) {
          iVar3 = GetStackIdx(cmd);
          local_11 = tbl_MovePackToDesk(iVar3);
        }
        else {
          _Var2 = IsCmdDesk(ActiveCmd);
          if (_Var2) {
            iVar3 = GetStackIdx(ActiveCmd);
            iVar4 = GetStackIdx(cmd);
            local_11 = tbl_MoveDeskToDesk(iVar3,iVar4);
          }
          else {
            _Var2 = IsCmdColor(ActiveCmd);
            if (_Var2) {
              iVar3 = GetStackIdx(ActiveCmd);
              iVar4 = GetStackIdx(cmd);
              local_11 = tbl_MoveColorsToDesk(iVar3,iVar4);
            }
          }
        }
      }
      else {
        if (cmd != CMD_PACK) {
          ActiveCmd = CMD_NONE;
          return false;
        }
        local_11 = false;
      }
    }
    ActiveCmd = CMD_NONE;
    EVar1 = ActiveCmd;
  }
  ActiveCmd = EVar1;
  if (local_11 == false) {
    dspl_SetMessage("!! Invalid move");
  }
  return true;
}

Assistant:

static bool ControlTable(ECommand_t cmd)
{
  bool rv = true;

  if (ActiveCmd == CMD_NONE) {
    if (cmd == CMD_NEXT) {
      tbl_DrawNextCard();
    } else if (cmd == CMD_PACK || IsCmdDesk(cmd) || IsCmdColor(cmd)) {
      // want one more key to complete action
      ActiveCmd = cmd;
    } else if (cmd == CMD_LAZY) {
      rv = AutoMove();
    } else {
      return false;
    }

  } else {
    rv = false;

    if (IsCmdColor(cmd) || cmd == ActiveCmd) {
      // move up or cancel action
      if (CMD_PACK == ActiveCmd) {
        rv = tbl_MovePackToColors();
      } else if (IsCmdDesk(ActiveCmd)) {
        rv = tbl_MoveDeskToColors(GetStackIdx(cmd));
      } else {
        rv = false;
      }
      rv = rv || ActiveCmd == cmd;

    } else if (IsCmdDesk(cmd)) {
      // move to desk
      if (CMD_PACK == ActiveCmd) {
        rv = tbl_MovePackToDesk(GetStackIdx(cmd));
      } else if (IsCmdDesk(ActiveCmd)) {
        rv = tbl_MoveDeskToDesk(GetStackIdx(ActiveCmd), GetStackIdx(cmd));
      } else if (IsCmdColor(ActiveCmd)) {
        rv = tbl_MoveColorsToDesk(GetStackIdx(ActiveCmd), GetStackIdx(cmd));
      }
    } else if (CMD_PACK == cmd) {
      rv = false;
    } else {
      // unsupported command
      ActiveCmd = CMD_NONE;
      return false;
    }

    ActiveCmd = CMD_NONE;
  }

  if (!rv) {
    dspl_SetMessage("!! Invalid move");
  }
  return true;
}